

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void boxsum(int32_t *src,int width,int height,int src_stride,int r,int sqr,int32_t *dst,
           int dst_stride)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int32_t *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined4 in_stack_00000008;
  
  if (in_R8D == 1) {
    boxsum1(in_RDI,in_ESI,in_EDX,in_ECX,in_R9D,(int32_t *)CONCAT44(sqr,in_stack_00000008),r);
  }
  else if (in_R8D == 2) {
    boxsum2(in_RDI,in_ESI,in_EDX,in_ECX,in_R9D,(int32_t *)CONCAT44(sqr,in_stack_00000008),r);
  }
  return;
}

Assistant:

static void boxsum(int32_t *src, int width, int height, int src_stride, int r,
                   int sqr, int32_t *dst, int dst_stride) {
  if (r == 1)
    boxsum1(src, width, height, src_stride, sqr, dst, dst_stride);
  else if (r == 2)
    boxsum2(src, width, height, src_stride, sqr, dst, dst_stride);
  else
    assert(0 && "Invalid value of r in self-guided filter");
}